

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_code_elimination.cpp
# Opt level: O0

void __thiscall mocker::DeadCodeElimination::mark(DeadCodeElimination *this)

{
  bool bVar1;
  reference pvVar2;
  element_type *peVar3;
  mapped_type *pmVar4;
  reference addr;
  element_type *peVar5;
  string *psVar6;
  mapped_type *pmVar7;
  element_type *this_00;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *this_01;
  element_type *this_02;
  LabelSet *this_03;
  reference pvVar8;
  FunctionModule *in_RDX;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar9;
  value_type_conflict label_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  LabelSet *__range2_1;
  size_t local_148;
  mapped_type curBB;
  size_t label;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *__range3;
  shared_ptr<mocker::ir::Phi> phi;
  InstID local_f8;
  InstID local_f0;
  undefined1 local_e8 [8];
  mapped_type defingInst;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Addr> *operand;
  __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
  local_b8;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *__range2;
  InstID local_78;
  undefined1 local_70 [8];
  value_type inst;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_8991fb9c markUsefulBB;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
  instDefine;
  DeadCodeElimination *this_local;
  
  buildInstDefine_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
              *)&markUsefulBB,(mocker *)(this->super_FuncPass).func,in_RDX);
  local_50.this = this;
  while (bVar1 = std::
                 queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
                 ::empty(&this->worklist), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::
             queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
             ::front(&this->worklist);
    std::shared_ptr<mocker::ir::IRInst>::shared_ptr
              ((shared_ptr<mocker::ir::IRInst> *)local_70,pvVar2);
    std::
    queue<std::shared_ptr<mocker::ir::IRInst>,_std::deque<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>_>
    ::pop(&this->worklist);
    peVar3 = std::__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_70);
    local_78 = ir::IRInst::getID(peVar3);
    pmVar4 = std::
             unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::at(&this->residingBB,&local_78);
    std::
    unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
    ::emplace<unsigned_long&>
              ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                *)&this->usefulBB,pmVar4);
    ir::getOperandsUsed((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         *)&__begin2,(shared_ptr<mocker::ir::IRInst> *)local_70);
    __end2 = std::
             vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
             ::begin((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      *)&__begin2);
    local_b8._M_current =
         (shared_ptr<mocker::ir::Addr> *)
         std::
         vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
         ::end((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_b8), bVar1) {
      addr = __gnu_cxx::
             __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
             ::operator*(&__end2);
      ir::dycLocalReg((ir *)&defingInst.
                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,addr);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &defingInst.
                          super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&defingInst.
                                  super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        psVar6 = ir::Reg::getIdentifier_abi_cxx11_(peVar5);
        bVar1 = std::operator==(psVar6,".phi_nan");
        if (!bVar1) {
          peVar5 = std::
                   __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&defingInst.
                                  super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
          psVar6 = ir::Reg::getIdentifier_abi_cxx11_(peVar5);
          bVar1 = isParameter(this,psVar6);
          if (!bVar1) {
            peVar5 = std::
                     __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&defingInst.
                                      super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            psVar6 = ir::Reg::getIdentifier_abi_cxx11_(peVar5);
            pmVar7 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
                     ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
                           *)&markUsefulBB,psVar6);
            std::shared_ptr<mocker::ir::IRInst>::shared_ptr
                      ((shared_ptr<mocker::ir::IRInst> *)local_e8,pmVar7);
            peVar3 = std::
                     __shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_e8);
            local_f0 = ir::IRInst::getID(peVar3);
            bVar1 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                              (&this->useful,&local_f0);
            if (!bVar1) {
              peVar3 = std::
                       __shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_e8);
              local_f8 = ir::IRInst::getID(peVar3);
              pVar9 = std::
                      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::emplace<unsigned_long>(&this->useful,&local_f8);
              phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     pVar9.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
              std::
              queue<std::shared_ptr<mocker::ir::IRInst>,std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>>
              ::emplace<std::shared_ptr<mocker::ir::IRInst>&>
                        ((queue<std::shared_ptr<mocker::ir::IRInst>,std::deque<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>>
                          *)&this->worklist,(shared_ptr<mocker::ir::IRInst> *)local_e8);
            }
            std::shared_ptr<mocker::ir::IRInst>::~shared_ptr
                      ((shared_ptr<mocker::ir::IRInst> *)local_e8);
          }
        }
      }
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                ((shared_ptr<mocker::ir::Reg> *)
                 &defingInst.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<mocker::ir::Addr>_*,_std::vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
    ~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
             *)&__begin2);
    ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
              ((ir *)&__range3,(shared_ptr<mocker::ir::IRInst> *)local_70);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range3);
    if (bVar1) {
      this_00 = std::__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&__range3);
      this_01 = ir::Phi::getOptions(this_00);
      __end3 = std::
               vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
               ::begin(this_01);
      option = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *)
               std::
               vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
               ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                                         *)&option), bVar1) {
        label = (size_t)__gnu_cxx::
                        __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                        ::operator*(&__end3);
        this_02 = std::
                  __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&((reference)label)->second);
        curBB = ir::Label::getID(this_02);
        mark::anon_class_8_1_8991fb9c::operator()(&local_50,curBB);
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    std::shared_ptr<mocker::ir::Phi>::~shared_ptr((shared_ptr<mocker::ir::Phi> *)&__range3);
    peVar3 = std::__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_70);
    __range2_1 = (LabelSet *)ir::IRInst::getID(peVar3);
    pmVar4 = std::
             unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::at(&this->residingBB,(key_type *)&__range2_1);
    local_148 = *pmVar4;
    this_03 = DominatorTree::getDominanceFrontier(&this->rdt,local_148);
    __end2_1 = std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::begin(this_03);
    label_1 = (value_type_conflict)
              std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::end(this_03);
    while (bVar1 = std::__detail::operator!=
                             (&__end2_1.super__Node_iterator_base<unsigned_long,_false>,
                              (_Node_iterator_base<unsigned_long,_false> *)&label_1), bVar1) {
      pvVar8 = std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator*(&__end2_1)
      ;
      mark::anon_class_8_1_8991fb9c::operator()(&local_50,*pvVar8);
      std::__detail::_Node_const_iterator<unsigned_long,_true,_false>::operator++(&__end2_1);
    }
    std::shared_ptr<mocker::ir::IRInst>::~shared_ptr((shared_ptr<mocker::ir::IRInst> *)local_70);
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::IRInst>_>_>_>
                    *)&markUsefulBB);
  return;
}

Assistant:

void DeadCodeElimination::mark() {
  std::unordered_map<std::string, std::shared_ptr<ir::IRInst>> instDefine =
      buildInstDefine(func);

  auto markUsefulBB = [this](std::size_t label) {
    auto &bb = func.getBasicBlock(label);
    auto terminator = bb.getInsts().back();
    if (isIn(useful, terminator->getID()))
      return;
    useful.emplace(terminator->getID());
    worklist.emplace(terminator);
  };

  while (!worklist.empty()) {
    auto inst = worklist.front();
    worklist.pop();
    usefulBB.emplace(residingBB.at(inst->getID()));
    for (auto &operand : ir::getOperandsUsed(inst)) {
      auto reg = ir::dycLocalReg(operand);
      if (!reg || reg->getIdentifier() == ".phi_nan" ||
          isParameter(reg->getIdentifier()))
        continue;
      auto defingInst = instDefine.at(reg->getIdentifier());
      if (isIn(useful, defingInst->getID()))
        continue;
      useful.emplace(defingInst->getID());
      worklist.emplace(defingInst);
    }
    if (auto phi = ir::dyc<ir::Phi>(inst)) {
      for (auto &option : phi->getOptions()) {
        auto label = option.second->getID();
        markUsefulBB(label);
      }
    }

    auto curBB = residingBB.at(inst->getID());
    for (auto label : rdt.getDominanceFrontier(curBB)) {
      markUsefulBB(label);
    }
  }
}